

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O3

void __thiscall QGraphicsScene::addItem(QGraphicsScene *this,QGraphicsItem *item)

{
  undefined1 *puVar1;
  int *piVar2;
  QGraphicsScene *this_00;
  QGraphicsScenePrivate *this_01;
  Data *pDVar3;
  QGraphicsWidgetPrivate *this_02;
  qreal qVar4;
  QGraphicsItemPrivate *pQVar5;
  qreal qVar6;
  QGraphicsItem **ppQVar7;
  QGraphicsView **ppQVar8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  WindowType WVar12;
  PanelModality PVar13;
  QMetaType QVar14;
  anon_union_24_3_e3d07ef4_for_data *paVar15;
  _Base_ptr p_Var16;
  QMapData<std::map<Qt::GestureType,_QFlags<Qt::GestureFlag>,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QFlags<Qt::GestureFlag>_>_>_>_>
  *pQVar17;
  QGraphicsWidget *pQVar18;
  size_t sVar19;
  QGraphicsItemPrivate *pQVar20;
  QGraphicsItem *pQVar21;
  uint uVar22;
  _Rb_tree_node_base *p_Var23;
  size_t sVar24;
  long lVar25;
  PrivateShared *this_03;
  long lVar26;
  long in_FS_OFFSET;
  QMetaMethod QVar27;
  QGraphicsScene *t;
  QVariant local_98;
  QGraphicsItem *copy;
  char *pcStack_70;
  QMetaTypeInterface *local_68;
  qreal qStack_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (item == (QGraphicsItem *)0x0) {
    addItem();
    goto LAB_0060502d;
  }
  this_00 = (QGraphicsScene *)((item->d_ptr).d)->scene;
  if (this_00 == this) {
    addItem();
    goto LAB_0060502d;
  }
  this_01 = *(QGraphicsScenePrivate **)(this + 8);
  if (this_00 != (QGraphicsScene *)0x0) {
    removeItem(this_00,item);
  }
  local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  t = (QGraphicsScene *)this;
  if ((__atomic_base<int>)
      QtPrivate::QMetaTypeInterfaceWrapper<QGraphicsScene_*>::metaType.typeId._q_value.
      super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    QMetaType::registerHelper(&QtPrivate::QMetaTypeInterfaceWrapper<QGraphicsScene_*>::metaType);
  }
  ::QVariant::moveConstruct
            ((QMetaTypeInterface *)&copy,
             &QtPrivate::QMetaTypeInterfaceWrapper<QGraphicsScene_*>::metaType);
  paVar15 = &local_58;
  (*item->_vptr_QGraphicsItem[0x21])(paVar15,item,0xb,(QMetaTypeInterface *)&copy);
  ::QVariant::~QVariant((QVariant *)&copy);
  copy = (QGraphicsItem *)&QtPrivate::QMetaTypeInterfaceWrapper<QGraphicsScene_*>::metaType;
  t = (QGraphicsScene *)((ulong)puStack_40 & 0xfffffffffffffffc);
  bVar9 = comparesEqual((QMetaType *)&t,(QMetaType *)&copy);
  if (bVar9) {
    if (((ulong)puStack_40 & 1) == 0) {
      paVar15 = &local_58;
    }
    else {
      paVar15 = (anon_union_24_3_e3d07ef4_for_data *)
                (local_58.shared + *(int *)(local_58.shared + 4));
    }
    this_03 = paVar15->shared;
  }
  else {
    t = (QGraphicsScene *)0x0;
    QVar14.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
    if (((ulong)puStack_40 & 1) != 0) {
      paVar15 = (anon_union_24_3_e3d07ef4_for_data *)
                (local_58.shared + *(int *)(local_58.shared + 4));
    }
    QMetaType::convert(QVar14,paVar15,(QMetaType)copy,&t);
    this_03 = (PrivateShared *)t;
  }
  if (this_03 == (PrivateShared *)this) {
    lVar25 = (this_01->unpolishedItems).d.size;
    if (lVar25 == 0) {
      iVar10 = (*(code *)**(undefined8 **)this)(this);
      QVar27 = (QMetaMethod)QMetaObject::method(iVar10);
      copy = (QGraphicsItem *)0x0;
      pcStack_70 = (char *)0x0;
      local_68 = (QMetaTypeInterface *)0x0;
      QMetaMethod::invokeImpl(QVar27,this,QueuedConnection,1,&copy,&pcStack_70,&local_68);
      lVar25 = (this_01->unpolishedItems).d.size;
    }
    copy = item;
    QtPrivate::QPodArrayOps<QGraphicsItem*>::emplace<QGraphicsItem*&>
              ((QPodArrayOps<QGraphicsItem*> *)&this_01->unpolishedItems,lVar25,&copy);
    QList<QGraphicsItem_*>::end(&this_01->unpolishedItems);
    puVar1 = &((item->d_ptr).d)->field_0x168;
    *(uint *)puVar1 = *(uint *)puVar1 | 0x100;
    pQVar20 = (item->d_ptr).d;
    if ((pQVar20->parent != (QGraphicsItem *)0x0) &&
       ((QGraphicsScene *)((pQVar20->parent->d_ptr).d)->scene != this)) {
      QGraphicsItem::setParentItem(item,(QGraphicsItem *)0x0);
      pQVar20 = (item->d_ptr).d;
    }
    pQVar20->scene = (QGraphicsScene *)this_03;
    (**(code **)(*(long *)this_01->index + 0xb0))(this_01->index,item);
    if (((item->d_ptr).d)->parent == (QGraphicsItem *)0x0) {
      QGraphicsScenePrivate::registerTopLevelItem(this_01,item);
    }
    local_68 = (QMetaTypeInterface *)0x0;
    qStack_60 = 0.0;
    copy = (QGraphicsItem *)0x0;
    pcStack_70 = (char *)0x0;
    sVar24 = 0;
    pQVar21 = item;
    QGraphicsScenePrivate::markDirty(this_01,item,(QRectF *)&copy,false,false,false,false,false);
    uVar11 = *(uint *)&this_01->field_0xb8;
    uVar22 = uVar11 | 2;
    *(uint *)&this_01->field_0xb8 = uVar22;
    this_01->selectionChanging = this_01->selectionChanging + 1;
    pDVar3 = (this_01->selectedItems).q_hash.d;
    if (pDVar3 != (Data *)0x0) {
      sVar24 = (size_t)(int)pDVar3->size;
    }
    if ((uVar11 >> 0xc & 1) != 0) {
      this_02 = (QGraphicsWidgetPrivate *)(item->d_ptr).d;
      uVar11 = (uint)*(undefined8 *)&(this_02->super_QGraphicsItemPrivate).field_0x160;
      if ((uVar11 >> 10 & 1) == 0) {
        if ((uVar11 >> 0x18 & 1) != 0) {
          bVar9 = QGraphicsWidgetPrivate::hasDecoration(this_02);
          uVar22 = *(uint *)&this_01->field_0xb8;
          if (bVar9) goto LAB_00604c4e;
        }
      }
      else {
LAB_00604c4e:
        *(uint *)&this_01->field_0xb8 = uVar22 & 0xffffefff;
        QGraphicsScenePrivate::enableMouseTrackingOnViews(this_01);
        uVar22 = *(uint *)&this_01->field_0xb8;
      }
    }
    uVar11 = uVar22;
    if (((uVar22 >> 0xd & 1) != 0) && ((((item->d_ptr).d)->field_0x161 & 0x80) != 0)) {
      uVar11 = uVar22 & 0xffffdfff;
      *(uint *)&this_01->field_0xb8 = uVar11;
      if ((uVar22 >> 0xc & 1) != 0) {
        QGraphicsScenePrivate::enableMouseTrackingOnViews(this_01);
        uVar11 = *(uint *)&this_01->field_0xb8;
      }
    }
    pQVar20 = (item->d_ptr).d;
    if (((uVar11 >> 0x10 & 1) != 0) && ((pQVar20->field_0x167 & 8) != 0)) {
      *(uint *)&this_01->field_0xb8 = uVar11 & 0xfffeffff;
      QGraphicsScenePrivate::enableTouchEventsOnViews(this_01);
      pQVar20 = (item->d_ptr).d;
    }
    pQVar17 = (pQVar20->gestureContext).d.d.ptr;
    if (pQVar17 ==
        (QMapData<std::map<Qt::GestureType,_QFlags<Qt::GestureFlag>,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QFlags<Qt::GestureFlag>_>_>_>_>
         *)0x0) {
      p_Var16 = (_Rb_tree_node_base *)0x0;
    }
    else {
      p_Var16 = (pQVar17->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    }
    while( true ) {
      p_Var23 = &(pQVar17->m)._M_t._M_impl.super__Rb_tree_header._M_header;
      if (pQVar17 ==
          (QMapData<std::map<Qt::GestureType,_QFlags<Qt::GestureFlag>,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QFlags<Qt::GestureFlag>_>_>_>_>
           *)0x0) {
        p_Var23 = (_Rb_tree_node_base *)0x0;
      }
      if (p_Var16 == p_Var23) break;
      QGraphicsScenePrivate::grabGesture(this_01,pQVar21,p_Var16[1]._M_color);
      p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
      pQVar17 = (((item->d_ptr).d)->gestureContext).d.d.ptr;
    }
    bVar9 = QGraphicsItem::isSelected(item);
    if (bVar9) {
      copy = item;
      QHash<QGraphicsItem*,QHashDummyValue>::emplace<QHashDummyValue_const&>
                ((QHash<QGraphicsItem*,QHashDummyValue> *)&this_01->selectedItems,&copy,
                 (QHashDummyValue *)&t);
    }
    bVar9 = QGraphicsItem::isWidget(item);
    if (bVar9) {
      bVar9 = QGraphicsItem::isVisible(item);
      if (bVar9) {
        WVar12 = QGraphicsWidget::windowType((QGraphicsWidget *)(item + -1));
        if (WVar12 == Popup) {
          QGraphicsScenePrivate::addPopup(this_01,(QGraphicsWidget *)(item + -1));
        }
      }
    }
    bVar9 = QGraphicsItem::isPanel(item);
    if (bVar9) {
      bVar9 = QGraphicsItem::isVisible(item);
      if (bVar9) {
        PVar13 = QGraphicsItem::panelModality(item);
        if (PVar13 != NonModal) {
          QGraphicsScenePrivate::enterModal(this_01,item,NonModal);
        }
      }
    }
    bVar9 = QGraphicsItem::isWidget(item);
    if (bVar9) {
      if (this_01->tabFocusFirst == (QGraphicsWidget *)0x0) {
        this_01->tabFocusFirst = (QGraphicsWidget *)(item + -1);
      }
      else {
        pQVar18 = QGraphicsItem::parentWidget(item);
        if (pQVar18 == (QGraphicsWidget *)0x0) {
          bVar9 = QGraphicsItem::isPanel(item);
          if (!bVar9) {
            pQVar18 = this_01->tabFocusFirst;
            pQVar20 = (pQVar18->super_QGraphicsObject).super_QGraphicsItem.d_ptr.d;
            qVar4 = pQVar20[1].needsRepaint.w;
            *(QGraphicsWidget **)(*(long *)((long)qVar4 + 0x18) + 0x1c0) =
                 (QGraphicsWidget *)(item + -1);
            pQVar5 = (item->d_ptr).d;
            qVar6 = pQVar5[1].needsRepaint.w;
            *(QGraphicsWidget **)(*(long *)((long)qVar6 + 0x18) + 0x1c0) = pQVar18;
            pQVar20[1].needsRepaint.w = qVar6;
            pQVar5[1].needsRepaint.w = qVar4;
          }
        }
      }
    }
    QGraphicsItemPrivate::ensureSortedChildren((item->d_ptr).d);
    pQVar20 = (item->d_ptr).d;
    lVar25 = (pQVar20->children).d.size;
    if (lVar25 != 0) {
      ppQVar7 = (pQVar20->children).d.ptr;
      lVar26 = 0;
      do {
        addItem(this,*(QGraphicsItem **)((long)ppQVar7 + lVar26));
        lVar26 = lVar26 + 8;
      } while (lVar25 << 3 != lVar26);
      pQVar20 = (item->d_ptr).d;
    }
    (*pQVar20->_vptr_QGraphicsItemPrivate[5])(pQVar20,(ulong)*(uint *)&this_01->field_0x2b0);
    pQVar20 = (item->d_ptr).d;
    uVar11 = QPalette::resolveMask();
    (*pQVar20->_vptr_QGraphicsItemPrivate[6])(pQVar20,(ulong)uVar11);
    piVar2 = &this_01->selectionChanging;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      pDVar3 = (this_01->selectedItems).q_hash.d;
      if (pDVar3 == (Data *)0x0) {
        sVar19 = 0;
      }
      else {
        sVar19 = pDVar3->size;
      }
      if (sVar19 != sVar24) {
        QMetaObject::activate((QObject *)this,&staticMetaObject,2,(void **)0x0);
      }
    }
    (*item->_vptr_QGraphicsItem[0x21])(&local_98,item,0x10,&local_58);
    ::QVariant::~QVariant(&local_98);
    if (this_01->childExplicitActivation == 0) {
      pQVar20 = (item->d_ptr).d;
      if ((*(uint *)&pQVar20->field_0x168 & 4) != 0) {
        this_01->childExplicitActivation = ((*(uint *)&pQVar20->field_0x168 & 8) == 0) + 1;
        goto LAB_00604f42;
      }
LAB_00604f74:
      if (pQVar20->parent == (QGraphicsItem *)0x0) {
LAB_00604f7e:
        this_01->childExplicitActivation = 0;
      }
      if ((this_01->lastActivePanel == (QGraphicsItem *)0x0) &&
         (this_01->activePanel == (QGraphicsItem *)0x0)) {
        bVar9 = QGraphicsItem::isPanel(item);
        if (bVar9) {
          if ((*(QGraphicsScenePrivate **)(this + 8))->activationRefCount < 1) {
            this_01->lastActivePanel = item;
          }
          else {
            QGraphicsScenePrivate::setActivePanelHelper
                      (*(QGraphicsScenePrivate **)(this + 8),item,false);
          }
        }
      }
    }
    else {
LAB_00604f42:
      bVar9 = QGraphicsItem::isPanel(item);
      if (!bVar9) {
        pQVar20 = (item->d_ptr).d;
        goto LAB_00604f74;
      }
      if (this_01->childExplicitActivation == 1) {
        QGraphicsScenePrivate::setActivePanelHelper
                  (*(QGraphicsScenePrivate **)(this + 8),item,false);
        goto LAB_00604f7e;
      }
      this_01->childExplicitActivation = 0;
    }
    if ((((item->d_ptr).d)->field_0x166 & 1) != 0) {
      QGraphicsScenePrivate::registerScenePosItem(this_01,item);
    }
    if ((this_01->focusItem == (QGraphicsItem *)0x0) && (this_01->lastFocusItem != item)) {
      pQVar21 = QGraphicsItem::focusItem(item);
      if (pQVar21 == item) {
        pQVar21 = QGraphicsItem::focusItem(item);
        QGraphicsItem::setFocus(pQVar21,OtherFocusReason);
      }
    }
    lVar25 = (this_01->views).d.size;
    if (lVar25 != 0) {
      ppQVar8 = (this_01->views).d.ptr;
      lVar26 = 0;
      do {
        QGraphicsViewPrivate::updateInputMethodSensitivity
                  (*(QGraphicsViewPrivate **)(*(long *)((long)ppQVar8 + lVar26) + 8));
        lVar26 = lVar26 + 8;
      } while (lVar25 << 3 != lVar26);
    }
  }
  else if ((this_03 != (PrivateShared *)0x0) &&
          ((QGraphicsScene *)((item->d_ptr).d)->scene != (QGraphicsScene *)this_03)) {
    addItem((QGraphicsScene *)this_03,item);
  }
  ::QVariant::~QVariant((QVariant *)&local_58);
LAB_0060502d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScene::addItem(QGraphicsItem *item)
{
    Q_D(QGraphicsScene);
    if (!item) {
        qWarning("QGraphicsScene::addItem: cannot add null item");
        return;
    }
    if (item->d_ptr->scene == this) {
        qWarning("QGraphicsScene::addItem: item has already been added to this scene");
        return;
    }
    // Remove this item from its existing scene
    if (QGraphicsScene *oldScene = item->d_ptr->scene)
        oldScene->removeItem(item);

    // Notify the item that its scene is changing, and allow the item to
    // react.
    const QVariant newSceneVariant(item->itemChange(QGraphicsItem::ItemSceneChange,
                                                    QVariant::fromValue<QGraphicsScene *>(this)));
    QGraphicsScene *targetScene = qvariant_cast<QGraphicsScene *>(newSceneVariant);
    if (targetScene != this) {
        if (targetScene && item->d_ptr->scene != targetScene)
            targetScene->addItem(item);
        return;
    }

    if (d->unpolishedItems.isEmpty()) {
        QMetaMethod method = metaObject()->method(d->polishItemsIndex);
        method.invoke(this, Qt::QueuedConnection);
    }
    d->unpolishedItems.append(item);
    item->d_ptr->pendingPolish = true;

    // Detach this item from its parent if the parent's scene is different
    // from this scene.
    if (QGraphicsItem *itemParent = item->d_ptr->parent) {
        if (itemParent->d_ptr->scene != this)
            item->setParentItem(nullptr);
    }

    // Add the item to this scene
    item->d_func()->scene = targetScene;

    // Add the item in the index
    d->index->addItem(item);

    // Add to list of toplevels if this item is a toplevel.
    if (!item->d_ptr->parent)
        d->registerTopLevelItem(item);

    // Add to list of items that require an update. We cannot assume that the
    // item is fully constructed, so calling item->update() can lead to a pure
    // virtual function call to boundingRect().
    d->markDirty(item);
    d->dirtyGrowingItemsBoundingRect = true;

    // Disable selectionChanged() for individual items
    ++d->selectionChanging;
    int oldSelectedItemSize = d->selectedItems.size();

    // Enable mouse tracking if we haven't already done so, and the item needs it.
    // We cannot use itemAcceptsHoverEvents_helper() here, since we need to enable
    // mouse tracking also if this item is temporarily blocked by a modal panel.

    auto needsMouseTracking = [](const QGraphicsItemPrivate *item) {
        return item->acceptsHover
                || (item->isWidget && static_cast<const QGraphicsWidgetPrivate *>(item)->hasDecoration());
    };

    if (d->allItemsIgnoreHoverEvents && needsMouseTracking(item->d_ptr.data())) {
        d->allItemsIgnoreHoverEvents = false;
        d->enableMouseTrackingOnViews();
    }
#ifndef QT_NO_CURSOR
    if (d->allItemsUseDefaultCursor && item->d_ptr->hasCursor) {
        d->allItemsUseDefaultCursor = false;
        if (d->allItemsIgnoreHoverEvents) // already enabled otherwise
            d->enableMouseTrackingOnViews();
    }
#endif //QT_NO_CURSOR

    // Enable touch events if the item accepts touch events.
    if (d->allItemsIgnoreTouchEvents && item->d_ptr->acceptTouchEvents) {
        d->allItemsIgnoreTouchEvents = false;
        d->enableTouchEventsOnViews();
    }

#ifndef QT_NO_GESTURES
    for (auto it = item->d_ptr->gestureContext.constBegin();
              it != item->d_ptr->gestureContext.constEnd(); ++it)
        d->grabGesture(item, it.key());
#endif

    // Update selection lists
    if (item->isSelected())
        d->selectedItems << item;
    if (item->isWidget() && item->isVisible() && static_cast<QGraphicsWidget *>(item)->windowType() == Qt::Popup)
        d->addPopup(static_cast<QGraphicsWidget *>(item));
    if (item->isPanel() && item->isVisible() && item->panelModality() != QGraphicsItem::NonModal)
        d->enterModal(item);

    // Update creation order focus chain. Make sure to leave the widget's
    // internal tab order intact.
    if (item->isWidget()) {
        QGraphicsWidget *widget = static_cast<QGraphicsWidget *>(item);
        if (!d->tabFocusFirst) {
            // No first tab focus widget - make this the first tab focus
            // widget.
            d->tabFocusFirst = widget;
        } else if (!widget->parentWidget() && !widget->isPanel()) {
            // Adding a widget that is not part of a tab focus chain.
            QGraphicsWidget *myNewPrev = d->tabFocusFirst->d_func()->focusPrev;
            myNewPrev->d_func()->focusNext = widget;
            widget->d_func()->focusPrev->d_func()->focusNext = d->tabFocusFirst;
            d->tabFocusFirst->d_func()->focusPrev = widget->d_func()->focusPrev;
            widget->d_func()->focusPrev = myNewPrev;
        }
    }

    // Add all children recursively
    item->d_ptr->ensureSortedChildren();
    for (auto child : std::as_const(item->d_ptr->children))
        addItem(child);

    // Resolve font and palette.
    item->d_ptr->resolveFont(d->font.resolveMask());
    item->d_ptr->resolvePalette(d->palette.resolveMask());


    // Re-enable selectionChanged() for individual items
    --d->selectionChanging;
    if (!d->selectionChanging && d->selectedItems.size() != oldSelectedItemSize)
        emit selectionChanged();

    // Deliver post-change notification
    item->itemChange(QGraphicsItem::ItemSceneHasChanged, newSceneVariant);

    // Update explicit activation
    bool autoActivate = true;
    if (!d->childExplicitActivation && item->d_ptr->explicitActivate)
        d->childExplicitActivation = item->d_ptr->wantsActive ? 1 : 2;
    if (d->childExplicitActivation && item->isPanel()) {
        if (d->childExplicitActivation == 1)
            setActivePanel(item);
        else
            autoActivate = false;
        d->childExplicitActivation = 0;
    } else if (!item->d_ptr->parent) {
        d->childExplicitActivation = 0;
    }

    // Auto-activate this item's panel if nothing else has been activated
    if (autoActivate) {
        if (!d->lastActivePanel && !d->activePanel && item->isPanel()) {
            if (isActive())
                setActivePanel(item);
            else
                d->lastActivePanel = item;
        }
    }

    if (item->d_ptr->flags & QGraphicsItem::ItemSendsScenePositionChanges)
        d->registerScenePosItem(item);

    // Ensure that newly added items that have subfocus set, gain
    // focus automatically if there isn't a focus item already.
    if (!d->focusItem && item != d->lastFocusItem && item->focusItem() == item)
        item->focusItem()->setFocus();

    d->updateInputMethodSensitivityInViews();
}